

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_then.cpp
# Opt level: O0

void __thiscall tst_qpromise_then::nullHandler(tst_qpromise_then *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  bool local_e2;
  bool local_e1;
  QString local_e0;
  QString local_c8;
  QString local_b0;
  undefined8 local_98;
  QString local_90;
  QPromiseBase<int> local_78;
  undefined1 local_68 [8];
  Promise p_1;
  int local_50 [4];
  undefined8 local_40;
  int local_34;
  QPromise<int> local_30;
  undefined1 local_20 [8];
  Promise p;
  tst_qpromise_then *this_local;
  
  local_34 = 0x2a;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)this;
  QtPromise::QPromise<int>::resolve(&local_30,&local_34);
  local_40 = 0;
  QtPromise::QPromiseBase<int>::then<decltype(nullptr)>
            ((QPromiseBase<int> *)local_20,(void **)&local_30);
  QtPromise::QPromise<int>::~QPromise(&local_30);
  local_50[0] = -1;
  iVar3 = waitForValue<int>((QPromise<int> *)local_20,local_50);
  bVar1 = QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                          ,0xaa);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    p_1.super_QPromiseBase<int>.m_d.d._3_1_ =
         QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_20);
    p_1.super_QPromiseBase<int>.m_d.d._2_1_ = 1;
    bVar2 = QTest::qCompare<bool,bool>
                      ((bool *)((long)&p_1.super_QPromiseBase<int>.m_d.d + 3),
                       (bool *)((long)&p_1.super_QPromiseBase<int>.m_d.d + 2),"p.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                       ,0xab);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 0;
    }
    else {
      p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
    }
  }
  else {
    p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_20);
  if (p_1.super_QPromiseBase<int>.m_d.d._4_4_ == 0) {
    QString::QString(&local_90,"foo");
    QtPromise::QPromiseBase<int>::reject<QString>(&local_78,&local_90);
    local_98 = 0;
    QtPromise::QPromiseBase<int>::then<decltype(nullptr)>
              ((QPromiseBase<int> *)local_68,&local_78._vptr_QPromiseBase);
    QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_78);
    QString::~QString(&local_90);
    QString::QString(&local_c8);
    waitForError<int,QString>(&local_b0,(QPromise<int> *)local_68,&local_c8);
    QString::QString(&local_e0,"foo");
    bVar2 = QTest::qCompare(&local_b0,&local_e0,"waitForError(p, QString{})","QString{\"foo\"}",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                            ,0xb0);
    QString::~QString(&local_e0);
    QString::~QString(&local_b0);
    QString::~QString(&local_c8);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_e1 = QtPromise::QPromiseBase<int>::isRejected((QPromiseBase<int> *)local_68);
      local_e2 = true;
      bVar2 = QTest::qCompare<bool,bool>
                        (&local_e1,&local_e2,"p.isRejected()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                         ,0xb1);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 0;
      }
      else {
        p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
      }
    }
    else {
      p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
    }
    QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_68);
  }
  return;
}

Assistant:

void tst_qpromise_then::nullHandler()
{
    { // resolved
        auto p = QtPromise::QPromise<int>::resolve(42).then(nullptr);

        QCOMPARE(waitForValue(p, -1), 42);
        QCOMPARE(p.isFulfilled(), true);
    }
    { // rejected
        auto p = QtPromise::QPromise<int>::reject(QString{"foo"}).then(nullptr);

        QCOMPARE(waitForError(p, QString{}), QString{"foo"});
        QCOMPARE(p.isRejected(), true);
    }
}